

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btJacobianEntry.h
# Opt level: O0

void __thiscall
btJacobianEntry::btJacobianEntry
          (btJacobianEntry *this,btMatrix3x3 *world2A,btMatrix3x3 *world2B,btVector3 *rel_pos1,
          btVector3 *rel_pos2,btVector3 *jointAxis,btVector3 *inertiaInvA,btScalar massInvA,
          btVector3 *inertiaInvB,btScalar massInvB)

{
  undefined8 uVar1;
  btVector3 *in_RDX;
  undefined8 *in_RDI;
  btVector3 *in_R8;
  undefined8 *in_R9;
  float in_XMM0_Da;
  btScalar bVar2;
  btScalar bVar3;
  float in_XMM1_Da;
  btVector3 bVar4;
  btVector3 *in_stack_ffffffffffffff28;
  btMatrix3x3 *m;
  
  uVar1 = in_R9[1];
  *in_RDI = *in_R9;
  in_RDI[1] = uVar1;
  m = (btMatrix3x3 *)(in_RDI + 2);
  btVector3::btVector3((btVector3 *)m);
  btVector3::btVector3((btVector3 *)(in_RDI + 4));
  btVector3::btVector3((btVector3 *)(in_RDI + 6));
  btVector3::btVector3((btVector3 *)(in_RDI + 8));
  btVector3::cross(m->m_el,in_stack_ffffffffffffff28);
  bVar4 = ::operator*(m,in_stack_ffffffffffffff28);
  in_RDI[2] = bVar4.m_floats._0_8_;
  in_RDI[3] = bVar4.m_floats._8_8_;
  operator-(in_R8);
  btVector3::cross(m->m_el,in_RDX);
  bVar4 = ::operator*(m,in_RDX);
  in_RDI[4] = bVar4.m_floats._0_8_;
  in_RDI[5] = bVar4.m_floats._8_8_;
  bVar4 = ::operator*(m->m_el,in_RDX);
  in_RDI[6] = bVar4.m_floats._0_8_;
  in_RDI[7] = bVar4.m_floats._8_8_;
  bVar4 = ::operator*(m->m_el,in_RDX);
  in_RDI[8] = bVar4.m_floats._0_8_;
  in_RDI[9] = bVar4.m_floats._8_8_;
  bVar2 = btVector3::dot((btVector3 *)(in_RDI + 6),(btVector3 *)(in_RDI + 2));
  bVar3 = btVector3::dot((btVector3 *)(in_RDI + 8),(btVector3 *)(in_RDI + 4));
  *(float *)(in_RDI + 10) = in_XMM0_Da + bVar2 + in_XMM1_Da + bVar3;
  return;
}

Assistant:

btJacobianEntry(
		const btMatrix3x3& world2A,
		const btMatrix3x3& world2B,
		const btVector3& rel_pos1,const btVector3& rel_pos2,
		const btVector3& jointAxis,
		const btVector3& inertiaInvA, 
		const btScalar massInvA,
		const btVector3& inertiaInvB,
		const btScalar massInvB)
		:m_linearJointAxis(jointAxis)
	{
		m_aJ = world2A*(rel_pos1.cross(m_linearJointAxis));
		m_bJ = world2B*(rel_pos2.cross(-m_linearJointAxis));
		m_0MinvJt	= inertiaInvA * m_aJ;
		m_1MinvJt = inertiaInvB * m_bJ;
		m_Adiag = massInvA + m_0MinvJt.dot(m_aJ) + massInvB + m_1MinvJt.dot(m_bJ);

		btAssert(m_Adiag > btScalar(0.0));
	}